

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison_operators.cpp
# Opt level: O3

void duckdb::ComparisonExecutor::Execute<duckdb::GreaterThan>
               (Vector *left,Vector *right,Vector *result,idx_t count)

{
  PhysicalType PVar1;
  unsigned_long *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  data_ptr_t pdVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  SelectionVector *pSVar5;
  idx_t iVar6;
  TemplatedValidityData<unsigned_long> *pTVar7;
  _Head_base<0UL,_unsigned_long_*,_false> _Var8;
  InternalException *this_00;
  idx_t iVar9;
  ulong uVar10;
  ValidityMask *pVVar11;
  ulong uVar12;
  idx_t iVar13;
  SelectionVector true_sel;
  UnifiedVectorFormat leftv;
  UnifiedVectorFormat rightv;
  SelectionVector local_128;
  _Head_base<0UL,_unsigned_long_*,_false> local_108;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> sStack_100;
  idx_t local_f0;
  _Head_base<0UL,_unsigned_long_*,_false> local_e0;
  SelectionVector local_d8;
  undefined1 local_c0 [16];
  SelectionVector local_b0 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  UnifiedVectorFormat local_78;
  
  PVar1 = (left->type).physical_type_;
  if (PVar1 < VARCHAR) {
    switch(PVar1) {
    case BOOL:
    case INT8:
      BinaryExecutor::
      ExecuteSwitch<signed_char,signed_char,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::GreaterThan,bool>
                (left,right,result,count,false);
      return;
    case UINT8:
      BinaryExecutor::
      ExecuteSwitch<unsigned_char,unsigned_char,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::GreaterThan,bool>
                (left,right,result,count,false);
      return;
    case UINT16:
      BinaryExecutor::
      ExecuteSwitch<unsigned_short,unsigned_short,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::GreaterThan,bool>
                (left,right,result,count,false);
      return;
    case INT16:
      BinaryExecutor::
      ExecuteSwitch<short,short,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::GreaterThan,bool>
                (left,right,result,count,false);
      return;
    case UINT32:
      BinaryExecutor::
      ExecuteSwitch<unsigned_int,unsigned_int,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::GreaterThan,bool>
                (left,right,result,count,false);
      return;
    case INT32:
      BinaryExecutor::
      ExecuteSwitch<int,int,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::GreaterThan,bool>
                (left,right,result,count,false);
      return;
    case UINT64:
      BinaryExecutor::
      ExecuteSwitch<unsigned_long,unsigned_long,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::GreaterThan,bool>
                (left,right,result,count,false);
      return;
    case INT64:
      BinaryExecutor::
      ExecuteSwitch<long,long,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::GreaterThan,bool>
                (left,right,result,count,false);
      return;
    default:
      goto switchD_00e147d3_caseD_a;
    case FLOAT:
      BinaryExecutor::
      ExecuteSwitch<float,float,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::GreaterThan,bool>
                (left,right,result,count,false);
      return;
    case DOUBLE:
      BinaryExecutor::
      ExecuteSwitch<double,double,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::GreaterThan,bool>
                (left,right,result,count,false);
      return;
    case INTERVAL:
      BinaryExecutor::
      ExecuteSwitch<duckdb::interval_t,duckdb::interval_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::GreaterThan,bool>
                (left,right,result,count,false);
      return;
    case LIST:
    case STRUCT:
    case ARRAY:
      goto switchD_00e147d3_caseD_17;
    }
  }
  if (PVar1 == VARCHAR) {
    BinaryExecutor::
    ExecuteSwitch<duckdb::string_t,duckdb::string_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::GreaterThan,bool>
              (left,right,result,count,false);
    return;
  }
  if (PVar1 == UINT128) {
    BinaryExecutor::
    ExecuteSwitch<duckdb::uhugeint_t,duckdb::uhugeint_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::GreaterThan,bool>
              (left,right,result,count,false);
    return;
  }
  if (PVar1 == INT128) {
    BinaryExecutor::
    ExecuteSwitch<duckdb::hugeint_t,duckdb::hugeint_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::GreaterThan,bool>
              (left,right,result,count,false);
    return;
  }
switchD_00e147d3_caseD_a:
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_c0._0_8_ = local_b0;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c0,"Invalid type for comparison","");
  InternalException::InternalException(this_00,(string *)local_c0);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
switchD_00e147d3_caseD_17:
  if (((left->vector_type == CONSTANT_VECTOR) &&
      (puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
      puVar2 != (unsigned_long *)0x0)) && ((*puVar2 & 1) == 0)) {
LAB_00e1480e:
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    ConstantVector::SetNull(result,true);
    return;
  }
  if (right->vector_type == CONSTANT_VECTOR) {
    puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) goto LAB_00e1480e;
    if (left->vector_type == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      pVVar11 = &result->validity;
      SelectionVector::SelectionVector((SelectionVector *)local_c0,1);
      iVar6 = VectorOperations::GreaterThan
                        (left,right,(optional_ptr<const_duckdb::SelectionVector,_true>)0x0,1,
                         (SelectionVector *)local_c0,
                         (optional_ptr<duckdb::SelectionVector,_true>)0x0,
                         (optional_ptr<duckdb::ValidityMask,_true>)pVVar11);
      _Var8._M_head_impl = (pVVar11->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (_Var8._M_head_impl == (unsigned_long *)0x0) {
        local_108._M_head_impl =
             (unsigned_long *)(result->validity).super_TemplatedValidityMask<unsigned_long>.capacity
        ;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)&local_78,(unsigned_long *)&local_108);
        pdVar3 = local_78.data;
        pSVar5 = local_78.sel;
        local_78.sel = (SelectionVector *)0x0;
        local_78.data = (data_ptr_t)0x0;
        this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)pSVar5;
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar3;
        if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.data !=
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.data);
        }
        pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                           (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                             validity_data);
        _Var8._M_head_impl =
             (pTVar7->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        (pVVar11->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var8._M_head_impl;
      }
      *(byte *)_Var8._M_head_impl = (byte)*_Var8._M_head_impl | 1;
      *result->data = iVar6 != 0;
      goto LAB_00e14e85;
    }
  }
  Vector::SetVectorType(result,FLAT_VECTOR);
  pdVar3 = result->data;
  FlatVector::VerifyFlatVector(result);
  UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_c0);
  Vector::ToUnifiedFormat(right,count,&local_78);
  pVVar11 = &result->validity;
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
      (unsigned_long *)0x0 ||
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0[0].sel_vector !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ComparesNotNull((UnifiedVectorFormat *)local_c0,&local_78,pVVar11,count);
  }
  local_108._M_head_impl = (unsigned_long *)0x0;
  sStack_100.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  sStack_100.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f0 = 0x800;
  local_d8.sel_vector = (sel_t *)0x800;
  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
            ((duckdb *)&local_128,(unsigned_long *)&local_d8);
  _Var4._M_pi = sStack_100.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  sStack_100.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_128.selection_data.internal.
       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  sStack_100.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)local_128.sel_vector;
  local_128.sel_vector = (sel_t *)0x0;
  local_128.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  if ((_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi),
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
     local_128.selection_data.internal.
     super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_128.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->(&sStack_100);
  local_108._M_head_impl =
       (pTVar7->owned_data).super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
       ._M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
       super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
  if (count != 0) {
    uVar12 = count + 0x3f >> 6;
    _Var8._M_head_impl = local_108._M_head_impl;
    if (uVar12 != 1) {
      local_e0._M_head_impl = local_108._M_head_impl;
      switchD_01043a80::default(local_108._M_head_impl,0xff,uVar12 * 8 - 8);
      _Var8._M_head_impl = local_e0._M_head_impl;
    }
    _Var8._M_head_impl[uVar12 - 1] =
         _Var8._M_head_impl[uVar12 - 1] |
         -(ulong)((count & 0x3f) == 0) | ~(-1L << ((byte)count & 0x3f));
  }
  _Var4._M_pi = sStack_100.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  local_f0 = count;
  local_d8.sel_vector = (sel_t *)count;
  if ((pVVar11->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    sStack_100.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    sStack_100.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
    }
    local_108._M_head_impl = (unsigned_long *)0x0;
  }
  else {
    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
              ((duckdb *)&local_128,(unsigned_long **)pVVar11,(unsigned_long *)&local_d8);
    _Var4._M_pi = sStack_100.internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    sStack_100.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_128.selection_data.internal.
         super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    sStack_100.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)local_128.sel_vector;
    local_128.sel_vector = (sel_t *)0x0;
    local_128.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    if ((_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi),
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_128.selection_data.internal.
       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_128.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->(&sStack_100)
    ;
    local_108._M_head_impl =
         (pTVar7->owned_data).
         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
         super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
  }
  SelectionVector::SelectionVector(&local_128,count);
  SelectionVector::SelectionVector(&local_d8,count);
  iVar6 = VectorOperations::GreaterThan
                    (left,right,(optional_ptr<const_duckdb::SelectionVector,_true>)0x0,count,
                     &local_128,&local_d8,(optional_ptr<duckdb::ValidityMask,_true>)pVVar11);
  if (iVar6 != 0) {
    puVar2 = (pVVar11->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar13 = 0;
    do {
      iVar9 = iVar13;
      if ((element_type *)local_128.sel_vector != (element_type *)0x0) {
        iVar9 = (idx_t)*(uint *)((long)&(((unsafe_unique_array<unsigned_long> *)local_128.sel_vector
                                         )->
                                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                        )._M_t.
                                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                        .super__Head_base<0UL,_unsigned_long_*,_false> + iVar13 * 4)
        ;
      }
      pdVar3[iVar9] = '\x01';
      if (local_108._M_head_impl == (unsigned_long *)0x0) {
        if (puVar2 != (unsigned_long *)0x0) goto LAB_00e14d9a;
      }
      else if ((local_108._M_head_impl[iVar9 >> 6] >> (iVar9 & 0x3f) & 1) != 0 &&
               puVar2 != (unsigned_long *)0x0) {
LAB_00e14d9a:
        puVar2[iVar9 >> 6] = puVar2[iVar9 >> 6] | 1L << ((byte)iVar9 & 0x3f);
      }
      iVar13 = iVar13 + 1;
    } while (iVar6 != iVar13);
  }
  if (count != iVar6) {
    puVar2 = (pVVar11->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    uVar12 = 0;
    do {
      uVar10 = uVar12;
      if (local_d8.sel_vector != (sel_t *)0x0) {
        uVar10 = (ulong)local_d8.sel_vector[uVar12];
      }
      pdVar3[uVar10] = '\0';
      if (local_108._M_head_impl == (unsigned_long *)0x0) {
        if (puVar2 != (unsigned_long *)0x0) goto LAB_00e14e0e;
      }
      else if ((local_108._M_head_impl[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0 &&
               puVar2 != (unsigned_long *)0x0) {
LAB_00e14e0e:
        puVar2[uVar10 >> 6] = puVar2[uVar10 >> 6] | 1L << ((byte)uVar10 & 0x3f);
      }
      uVar12 = uVar12 + 1;
    } while (count - iVar6 != uVar12);
  }
  if (local_d8.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_128.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_128.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (sStack_100.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_100.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_b0[0].sel_vector =
       (sel_t *)local_b0[0].selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80._M_pi);
    local_b0[0].sel_vector =
         (sel_t *)local_b0[0].selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
  }
LAB_00e14e85:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0[0].sel_vector !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0[0].sel_vector);
  }
  return;
}

Assistant:

static inline void Execute(Vector &left, Vector &right, Vector &result, idx_t count) {
		D_ASSERT(left.GetType().InternalType() == right.GetType().InternalType() &&
		         result.GetType() == LogicalType::BOOLEAN);
		// the inplace loops take the result as the last parameter
		switch (left.GetType().InternalType()) {
		case PhysicalType::BOOL:
		case PhysicalType::INT8:
			TemplatedExecute<int8_t, OP>(left, right, result, count);
			break;
		case PhysicalType::INT16:
			TemplatedExecute<int16_t, OP>(left, right, result, count);
			break;
		case PhysicalType::INT32:
			TemplatedExecute<int32_t, OP>(left, right, result, count);
			break;
		case PhysicalType::INT64:
			TemplatedExecute<int64_t, OP>(left, right, result, count);
			break;
		case PhysicalType::UINT8:
			TemplatedExecute<uint8_t, OP>(left, right, result, count);
			break;
		case PhysicalType::UINT16:
			TemplatedExecute<uint16_t, OP>(left, right, result, count);
			break;
		case PhysicalType::UINT32:
			TemplatedExecute<uint32_t, OP>(left, right, result, count);
			break;
		case PhysicalType::UINT64:
			TemplatedExecute<uint64_t, OP>(left, right, result, count);
			break;
		case PhysicalType::INT128:
			TemplatedExecute<hugeint_t, OP>(left, right, result, count);
			break;
		case PhysicalType::UINT128:
			TemplatedExecute<uhugeint_t, OP>(left, right, result, count);
			break;
		case PhysicalType::FLOAT:
			TemplatedExecute<float, OP>(left, right, result, count);
			break;
		case PhysicalType::DOUBLE:
			TemplatedExecute<double, OP>(left, right, result, count);
			break;
		case PhysicalType::INTERVAL:
			TemplatedExecute<interval_t, OP>(left, right, result, count);
			break;
		case PhysicalType::VARCHAR:
			TemplatedExecute<string_t, OP>(left, right, result, count);
			break;
		case PhysicalType::LIST:
		case PhysicalType::STRUCT:
		case PhysicalType::ARRAY:
			NestedComparisonExecutor<OP>(left, right, result, count);
			break;
		default:
			throw InternalException("Invalid type for comparison");
		}
	}